

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGlyphs.cpp
# Opt level: O2

void __thiscall chrono::ChGlyphs::ArchiveIN(ChGlyphs *this,ChArchiveIn *marchive)

{
  eCh_GlyphType_mapper mmapper;
  ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType> local_110;
  ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType> local_f0;
  ChNameValue<bool> local_d0;
  ChNameValue<double> local_b8;
  ChNameValue<chrono::ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>_> local_a0;
  ChNameValue<std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>_>
  local_88;
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_70;
  ChNameValue<std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>_> local_58;
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_40;
  
  ChArchiveIn::VersionRead<chrono::ChGlyphs>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_40._value = &this->points;
  local_40._name = "points";
  local_40._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_40);
  local_58._value = &this->colors;
  local_58._name = "colors";
  local_58._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_58);
  local_70._value = &this->vectors;
  local_70._name = "vectors";
  local_70._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_70);
  local_88._value = &this->rotations;
  local_88._name = "rotations";
  local_88._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_88);
  eCh_GlyphType_mapper::eCh_GlyphType_mapper((eCh_GlyphType_mapper *)&local_f0);
  eCh_GlyphType_mapper::operator()(&local_110,(eCh_GlyphType_mapper *)&local_f0,&this->draw_mode);
  local_a0._name = "draw_mode";
  local_a0._flags = '\0';
  local_a0._value = &local_110;
  ChArchiveIn::operator>>(marchive,&local_a0);
  ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>::~ChEnumMapper(&local_110);
  local_b8._value = &this->size;
  local_b8._name = "size";
  local_b8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_b8);
  local_d0._value = &this->zbuffer_hide;
  local_d0._name = "zbuffer_hide";
  local_d0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_d0);
  ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>::~ChEnumMapper(&local_f0);
  return;
}

Assistant:

void ChGlyphs::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChGlyphs>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(points);
    marchive >> CHNVP(colors);
    marchive >> CHNVP(vectors);
    marchive >> CHNVP(rotations);
    eCh_GlyphType_mapper mmapper;
    marchive >> CHNVP(mmapper(draw_mode), "draw_mode");
    marchive >> CHNVP(size);
    marchive >> CHNVP(zbuffer_hide);
}